

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

void Cut_CellPrecompute(void)

{
  short *psVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Cut_CMan_t *p;
  Cut_Cell_t *pCVar7;
  ulong uVar8;
  uint (*pauVar9) [16];
  Cut_Cell_t *pCell;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  int *in_R9;
  uint *puVar13;
  long lVar14;
  uint (*pauVar15) [16];
  uint (*pauVar16) [16];
  long lVar17;
  timespec ts;
  long local_80;
  timespec local_70;
  long local_60;
  uint (*local_58) [16];
  uint (*local_50) [16];
  uint (*local_48) [16];
  uint (*local_40) [16];
  uint *local_38;
  
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    local_60 = -1;
  }
  else {
    local_60 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  p = Cut_CManStart();
  pauVar15 = p->uTemp1;
  lVar11 = 0;
  do {
    Cut_CellTruthElem(p->uInputs[0],p->uInputs[1],p->uInputs[2],*pauVar15,(int)lVar11,(int)in_R9);
    lVar11 = lVar11 + 1;
    pauVar15 = pauVar15 + 1;
  } while (lVar11 != 0x16);
  pauVar15 = p->uTemp2;
  lVar11 = 0;
  do {
    Cut_CellTruthElem(p->uInputs[3],p->uInputs[4],p->uInputs[5],*pauVar15,(int)lVar11,(int)in_R9);
    lVar11 = lVar11 + 1;
    pauVar15 = pauVar15 + 1;
  } while (lVar11 != 0x16);
  pauVar15 = p->uTemp3;
  lVar11 = 0;
  do {
    Cut_CellTruthElem(p->uInputs[6],p->uInputs[7],p->uInputs[8],*pauVar15,(int)lVar11,(int)in_R9);
    lVar11 = lVar11 + 1;
    pauVar15 = pauVar15 + 1;
  } while (lVar11 != 0x16);
  local_58 = p->uTemp2;
  local_50 = p->uTemp3;
  local_38 = p->puAux;
  local_80 = 0;
  do {
    lVar11 = 0;
    do {
      local_48 = p->uTemp1 + lVar11;
      lVar14 = 0;
      do {
        local_40 = local_58 + lVar14;
        lVar17 = 0;
        do {
          pCVar7 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
          memset(pCVar7,0,0x98);
          *(uint *)&pCVar7->field_0x20 = *(uint *)&pCVar7->field_0x20 & 0xfffffff0 | 9;
          iVar4 = s_NPNe3[local_80];
          pCVar7->Box[0] = (char)iVar4;
          pCVar7->Box[1] = (char)lVar11;
          pCVar7->Box[2] = (char)lVar14;
          pCVar7->Box[3] = (char)lVar17;
          uVar8 = 0;
          do {
            pCVar7->CanonPerm[uVar8] = (char)uVar8;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (*(uint *)&pCVar7->field_0x20 & 0xf));
          Cut_CellTruthElem(*local_48,*local_40,local_50[lVar17],pCVar7->uTruth,iVar4,(int)in_R9);
          Cut_CellSuppMin(pCVar7);
          psVar1 = pCVar7->Store;
          uVar5 = Extra_TruthSemiCanonicize
                            (pCVar7->uTruth,local_38,*(uint *)&pCVar7->field_0x20 & 0xf,
                             pCVar7->CanonPerm,psVar1);
          *(uint *)&pCVar7->field_0x20 = *(uint *)&pCVar7->field_0x20 & 0x3fff | uVar5 << 0xe;
          p->nTotal = p->nTotal + 1;
          iVar4 = Cut_CellTableLookup(p,pCVar7);
          if (iVar4 == 0) {
            p->nGood = p->nGood + 1;
            p->nVarCounts[*(uint *)&pCVar7->field_0x20 & 0xf] =
                 p->nVarCounts[*(uint *)&pCVar7->field_0x20 & 0xf] + 1;
            if (((pCVar7->field_0x20 & 0xf) != 0) &&
               (uVar5 = *(uint *)&pCVar7->field_0x20 & 0xf, 1 < uVar5)) {
              iVar4 = 0;
              do {
                sVar2 = psVar1[iVar4 * 2];
                if (sVar2 == psVar1[iVar4 * 2 + 2]) {
                  uVar8 = (ulong)(iVar4 + 1U);
                  if ((int)(iVar4 + 1U) < (int)uVar5) {
                    puVar13 = pCVar7->uTruth + (long)iVar4 + -8;
                    uVar12 = (long)iVar4 + 1;
                    do {
                      uVar8 = uVar12;
                      if (sVar2 != (short)*puVar13) break;
                      uVar12 = uVar12 + 1;
                      puVar13 = puVar13 + 1;
                      uVar8 = (ulong)uVar5;
                    } while (uVar5 != uVar12);
                  }
                  in_R9 = p->nSymGroupsE;
                  piVar10 = p->nSymGroups;
                  if (sVar2 == psVar1[(int)(iVar4 * 2 | 1)]) {
                    piVar10 = in_R9;
                  }
                  piVar10[(int)uVar8 - iVar4] = piVar10[(int)uVar8 - iVar4] + 1;
                  iVar4 = (int)uVar8 + -1;
                }
                iVar4 = iVar4 + 1;
                uVar5 = *(uint *)&pCVar7->field_0x20 & 0xf;
              } while (iVar4 < (int)(uVar5 - 1));
            }
          }
          else {
            Extra_MmFixedEntryRecycle(p->pMem,(char *)pCVar7);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x16);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x16);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x16);
    local_80 = local_80 + 1;
  } while (local_80 != 10);
  iVar4 = 0x874354;
  printf("BASIC: Total = %d. Good = %d. Entry = %d. ",(ulong)(uint)p->nTotal,(ulong)(uint)p->nGood);
  Abc_Print(iVar4,"%s =","Time");
  iVar6 = 3;
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar11 - local_60) / 1000000.0);
  printf("Cells:  ");
  uVar8 = 0;
  do {
    printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar8]);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 10);
  printf("\nDiffs:  ");
  uVar8 = 0;
  do {
    printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nSymGroups[uVar8]);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 10);
  printf("\nEquals: ");
  uVar8 = 0;
  do {
    printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nSymGroupsE[uVar8]);
    uVar8 = uVar8 + 1;
  } while (uVar8 != 10);
  putchar(10);
  pauVar15 = (uint (*) [16])&DAT_00000009;
  do {
    pCVar7 = p->pSameVar[(long)pauVar15];
    pauVar16 = pauVar15;
    for (; pCVar7 != (Cut_Cell_t *)0x0; pCVar7 = pCVar7->pNextVar) {
      pauVar9 = (uint (*) [16])0x0;
      local_58 = pauVar15;
      do {
        iVar4 = (int)pauVar9;
        pauVar9 = (uint (*) [16])(ulong)(iVar4 + 1);
        if (pauVar9 < pauVar16) {
          pauVar15 = pauVar9;
          do {
            local_48 = (uint (*) [16])CONCAT44(local_48._4_4_,((uint)pauVar15 & 0xf) << 8);
            iVar6 = 0;
            local_50 = pauVar15;
            do {
              pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
              memset(pCell,0,0x98);
              uVar5 = *(uint *)&pCVar7->field_0x20 & 0xf;
              *(uint *)&pCell->field_0x20 = *(uint *)&pCell->field_0x20 & 0xfffffff0 | uVar5;
              pCell->pParent = pCVar7;
              if (uVar5 != 0) {
                uVar8 = 0;
                do {
                  pCell->CanonPerm[uVar8] = (char)uVar8;
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (*(uint *)&pCell->field_0x20 & 0xf));
              }
              uVar5 = *(uint *)&pCVar7->field_0x20 & 0xf;
              uVar8 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
              if (uVar5 < 6) {
                uVar8 = 1;
              }
              lVar11 = uVar8 + 0x14;
              do {
                *(undefined4 *)(pCell->Box + lVar11 * 4 + -0x1c) =
                     *(undefined4 *)(pCVar7->Box + lVar11 * 4 + -0x1c);
                lVar14 = lVar11 + -0x14;
                lVar11 = lVar11 + -1;
              } while (1 < lVar14);
              uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
              *(uint *)&pCell->field_0x20 =
                   iVar6 * 0x1000 + (int)local_48 +
                   (*(uint *)&pCell->field_0x20 & 0xffffc00f | iVar4 << 4);
              uVar8 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
              if (uVar5 < 6) {
                uVar8 = 1;
              }
              do {
                Cut_CellSuppMin::uTemp[uVar8 + 0xf] = pCell->uTruth[uVar8 - 1];
                bVar3 = 1 < (long)uVar8;
                uVar8 = uVar8 - 1;
              } while (bVar3);
              uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
              uVar8 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
              if (uVar5 < 6) {
                uVar8 = 1;
              }
              do {
                *(uint *)(Cut_CellCrossBar_uTemp0 + uVar8 * 4 + 0x3c) = pCell->uTruth[uVar8 - 1];
                bVar3 = 1 < (long)uVar8;
                uVar8 = uVar8 - 1;
              } while (bVar3);
              uVar5 = *(uint *)&pCell->field_0x20;
              local_40 = (uint (*) [16])CONCAT44(local_40._4_4_,iVar6);
              if (uVar5 < 0x4000) {
                Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar5 & 0xf,uVar5 >> 4 & 0xf);
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 4 & 0xf);
LAB_0043a131:
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              }
              else {
                if (uVar5 >> 0xe != 2) {
                  if (uVar5 >> 0xe != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutPre22.c"
                                  ,0x26f,"void Cut_CellCrossBar(Cut_Cell_t *)");
                  }
                  Extra_TruthCofactor1((uint *)Cut_CellCrossBar_uTemp0,uVar5 & 0xf,uVar5 >> 4 & 0xf)
                  ;
                  Extra_TruthCofactor0
                            ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                  Extra_TruthCofactor0
                            ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 4 & 0xf);
                  goto LAB_0043a131;
                }
                Extra_TruthCofactor0((uint *)Cut_CellCrossBar_uTemp0,uVar5 & 0xf,uVar5 >> 4 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp0,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
                Extra_TruthCofactor1
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 4 & 0xf);
                Extra_TruthCofactor0
                          ((uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                           *(uint *)&pCell->field_0x20 >> 8 & 0xf);
              }
              Extra_TruthMux(pCell->uTruth,(uint *)Cut_CellCrossBar_uTemp0,
                             (uint *)Cut_CellCrossBar_uTemp1,*(uint *)&pCell->field_0x20 & 0xf,
                             *(uint *)&pCell->field_0x20 >> 4 & 0xf);
              Cut_CellSuppMin(pCell);
              psVar1 = pCell->Store;
              uVar5 = Extra_TruthSemiCanonicize
                                (pCell->uTruth,local_38,*(uint *)&pCell->field_0x20 & 0xf,
                                 pCell->CanonPerm,psVar1);
              *(uint *)&pCell->field_0x20 = *(uint *)&pCell->field_0x20 & 0x3fff | uVar5 << 0xe;
              p->nTotal = p->nTotal + 1;
              iVar6 = Cut_CellTableLookup(p,pCell);
              if (iVar6 == 0) {
                p->nGood = p->nGood + 1;
                p->nVarCounts[*(uint *)&pCell->field_0x20 & 0xf] =
                     p->nVarCounts[*(uint *)&pCell->field_0x20 & 0xf] + 1;
                uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
                if (1 < uVar5) {
                  iVar6 = 0;
                  do {
                    sVar2 = psVar1[iVar6 * 2];
                    if (sVar2 == psVar1[iVar6 * 2 + 2]) {
                      uVar8 = (ulong)(iVar6 + 1U);
                      if ((int)(iVar6 + 1U) < (int)uVar5) {
                        puVar13 = pCell->uTruth + (long)iVar6 + -8;
                        uVar12 = (long)iVar6 + 1;
                        do {
                          uVar8 = uVar12;
                          if (sVar2 != (short)*puVar13) break;
                          uVar12 = uVar12 + 1;
                          puVar13 = puVar13 + 1;
                          uVar8 = (ulong)uVar5;
                        } while (uVar5 != uVar12);
                      }
                      piVar10 = p->nSymGroups;
                      if (sVar2 == psVar1[(int)(iVar6 * 2 | 1)]) {
                        piVar10 = p->nSymGroupsE;
                      }
                      piVar10[(int)uVar8 - iVar6] = piVar10[(int)uVar8 - iVar6] + 1;
                      iVar6 = (int)uVar8 + -1;
                    }
                    iVar6 = iVar6 + 1;
                    uVar5 = *(uint *)&pCell->field_0x20 & 0xf;
                  } while (iVar6 < (int)(uVar5 - 1));
                }
              }
              else {
                Extra_MmFixedEntryRecycle(p->pMem,(char *)pCell);
              }
              iVar6 = (int)local_40 + 1;
            } while (iVar6 != 3);
            pauVar15 = (uint (*) [16])(ulong)((int)local_50 + 1);
            pauVar16 = local_58;
          } while (pauVar15 < local_58);
        }
      } while (pauVar16 != pauVar9);
      pauVar15 = local_58;
    }
    iVar4 = 0x87439c;
    printf("VAR %d: Total = %d. Good = %d. Entry = %d. ",(ulong)pauVar16 & 0xffffffff,
           (ulong)(uint)p->nTotal,(ulong)(uint)p->nGood,0x98);
    Abc_Print(iVar4,"%s =","Time");
    iVar6 = 3;
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar11 - local_60) / 1000000.0);
    printf("Cells:  ");
    uVar8 = 0;
    do {
      printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nVarCounts[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    printf("\nDiffs:  ");
    uVar8 = 0;
    do {
      printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nSymGroups[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    printf("\nEquals: ");
    uVar8 = 0;
    do {
      printf("%d=%d ",uVar8 & 0xffffffff,(ulong)(uint)p->nSymGroupsE[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    iVar4 = 10;
    putchar(10);
    pauVar15 = (uint (*) [16])((long)pauVar16[-1] + 0x3f);
    if (pauVar16 < &DAT_00000005) {
      Abc_Print(iVar4,"%s =","Supp ");
      Abc_Print(iVar4,"%9.2f sec\n",(double)p->timeSupp / 1000000.0);
      Abc_Print(iVar4,"%s =","Canon");
      Abc_Print(iVar4,"%9.2f sec\n",(double)p->timeCanon / 1000000.0);
      Abc_Print(iVar4,"%s =","Table");
      Abc_Print(iVar4,"%9.2f sec\n",(double)p->timeTable / 1000000.0);
      return;
    }
  } while( true );
}

Assistant:

void Cut_CellPrecompute()
{
    Cut_CMan_t * p;
    Cut_Cell_t * pCell, * pTemp;
    int i1, i2, i3, i, j, k, c;
    abctime clk = Abc_Clock(); //, clk2 = Abc_Clock();

    p = Cut_CManStart();

    // precompute truth tables
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[0], p->uInputs[1], p->uInputs[2], p->uTemp1[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[3], p->uInputs[4], p->uInputs[5], p->uTemp2[i], 9, i );
    for ( i = 0; i < 22; i++ )
        Cut_CellTruthElem( p->uInputs[6], p->uInputs[7], p->uInputs[8], p->uTemp3[i], 9, i );
/*
        if ( k == 8 && ((i1 == 6 && i2 == 14 && i3 == 20) || (i1 == 20 && i2 == 6 && i3 == 14)) )
        {
            Extra_PrintBinary( stdout, &pCell->CanonPhase, pCell->nVars+1 ); printf( " : " );
            for ( i = 0; i < pCell->nVars; i++ )
                printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
            Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars );
            printf( "\n" );
        }
*/
/*
    // go through symmetric roots
    for ( k = 0; k < 5; k++ )
    for ( i1 =  0; i1 < 22; i1++ )
    for ( i2 = i1; i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3s[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3s[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through partially symmetric roots
    for ( k = 0; k < 4; k++ )
    for ( i1 = 0;  i1 < 22; i1++ )
    for ( i2 = 0;  i2 < 22; i2++ )
    for ( i3 = i2; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3p[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3p[k] );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }

    // go through non-symmetric functions
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = 17;
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, 17 );
        // canonicize
        Cut_CellCanonicize( pCell );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
            p->nGood++;
    }
*/

    // go through non-symmetric functions
    for ( k = 0; k < 10; k++ )
    for ( i1 = 0; i1 < 22; i1++ )
    for ( i2 = 0; i2 < 22; i2++ )
    for ( i3 = 0; i3 < 22; i3++ )
    {
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars  = 9;
        pCell->Box[0] = s_NPNe3[k];
        pCell->Box[1] = i1;
        pCell->Box[2] = i2;
        pCell->Box[3] = i3;
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // fill in the truth table
        Cut_CellTruthElem( p->uTemp1[i1], p->uTemp2[i2], p->uTemp3[i3], pCell->uTruth, 9, s_NPNe3[k] );
        // minimize the support
        Cut_CellSuppMin( pCell );

        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );

        // add to the table
        p->nTotal++;
        if ( Cut_CellTableLookup( p, pCell ) ) // already exists
            Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
        else
        {
            p->nGood++;
            p->nVarCounts[pCell->nVars]++;

            if ( pCell->nVars )
            for ( i = 0; i < (int)pCell->nVars-1; i++ )
            {
                if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                    continue;
                // i and i+1 can be symmetric
                // find the end of this group
                for ( j = i+1; j < (int)pCell->nVars; j++ )
                    if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                        break;

                if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                    p->nSymGroupsE[j-i]++;
                else
                    p->nSymGroups[j-i]++;
                i = j - 1;
            }
/*
            if ( pCell->nVars == 3 )
            {
                Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                for ( i = 0; i < (int)pCell->nVars; i++ )
                    printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                printf( "\n" );
            }
*/
        }
    }

    printf( "BASIC: Total = %d. Good = %d. Entry = %d. ", (int)p->nTotal, (int)p->nGood, (int)sizeof(Cut_Cell_t) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    printf( "Cells:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nVarCounts[i] );
    printf( "\nDiffs:  " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroups[i] );
    printf( "\nEquals: " );
    for ( i = 0; i <= 9; i++ )
        printf( "%d=%d ", i, p->nSymGroupsE[i] );
    printf( "\n" );

    // continue adding new cells using support
    for ( k = CUT_CELL_MVAR; k > 3; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        for ( i1 = 0; i1 < k; i1++ )
        for ( i2 = i1+1; i2 < k; i2++ )
        for ( c = 0; c < 3; c++ )
        {
            // derive the cell
            pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
            memset( pCell, 0, sizeof(Cut_Cell_t) );
            pCell->nVars   = pTemp->nVars;
            pCell->pParent = pTemp;
            // set the elementary permutation
            for ( i = 0; i < (int)pCell->nVars; i++ )
                pCell->CanonPerm[i] = i;
            // fill in the truth table
            Extra_TruthCopy( pCell->uTruth, pTemp->uTruth, pTemp->nVars );
            // create the cross-bar
            pCell->CrossBar0 = i1;
            pCell->CrossBar1 = i2;
            pCell->CrossBarPhase = c;
            Cut_CellCrossBar( pCell );
            // minimize the support
//clk2 = Abc_Clock();
            Cut_CellSuppMin( pCell );
//p->timeSupp += Abc_Clock() - clk2;
            // canonicize
//clk2 = Abc_Clock();
            pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
//p->timeCanon += Abc_Clock() - clk2;

            // add to the table
//clk2 = Abc_Clock();
            p->nTotal++;
            if ( Cut_CellTableLookup( p, pCell ) ) // already exists
                Extra_MmFixedEntryRecycle( p->pMem, (char *)pCell );
            else
            {
                p->nGood++;
                p->nVarCounts[pCell->nVars]++;

                for ( i = 0; i < (int)pCell->nVars-1; i++ )
                {
                    if ( pCell->Store[2*i] != pCell->Store[2*(i+1)] ) // i and i+1 cannot be symmetric
                        continue;
                    // i and i+1 can be symmetric
                    // find the end of this group
                    for ( j = i+1; j < (int)pCell->nVars; j++ )
                        if ( pCell->Store[2*i] != pCell->Store[2*j] ) 
                            break;

                    if ( pCell->Store[2*i] == pCell->Store[2*i+1] )
                        p->nSymGroupsE[j-i]++;
                    else
                        p->nSymGroups[j-i]++;
                    i = j - 1;
                }
/*
                if ( pCell->nVars == 3 )
                {
                    Extra_PrintBinary( stdout, pCell->uTruth, 32 ); printf( "\n" );
                    for ( i = 0; i < (int)pCell->nVars; i++ )
                        printf( "%d=%d/%d  ", pCell->CanonPerm[i], pCell->Store[2*i], pCell->Store[2*i+1] );
                    printf( "\n" );
                }
*/
            }
//p->timeTable += Abc_Clock() - clk2;
        }

        printf( "VAR %d: Total = %d. Good = %d. Entry = %d. ", k, p->nTotal, p->nGood, (int)sizeof(Cut_Cell_t) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Cells:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nVarCounts[i] );
        printf( "\nDiffs:  " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroups[i] );
        printf( "\nEquals: " );
        for ( i = 0; i <= 9; i++ )
            printf( "%d=%d ", i, p->nSymGroupsE[i] );
        printf( "\n" );
    }
//    printf( "\n" );
    ABC_PRT( "Supp ", p->timeSupp );
    ABC_PRT( "Canon", p->timeCanon );
    ABC_PRT( "Table", p->timeTable );
//    Cut_CManStop( p );
}